

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O2

void __thiscall ftxui::ScreenInteractive::Loop(ScreenInteractive *this,Component *component)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  allocator_type *in_RCX;
  __pthread_internal_list *__a;
  SignalHandler *extraout_RDX;
  SignalHandler *handler;
  SignalHandler *extraout_RDX_00;
  SignalHandler *handler_00;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  *parameters;
  int signal;
  anon_class_1_0_00000001 *paVar8;
  long lVar9;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l_00;
  initializer_list<ftxui::(anonymous_namespace)::DECMode> __l_01;
  Event event;
  undefined1 local_168 [16];
  _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_158;
  thread event_listener;
  _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_120;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_108;
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_f8;
  _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  local_e0;
  termios local_c4;
  undefined1 local_88 [64];
  _Any_data __tmp;
  Event *parameters_00;
  Event *parameters_01;
  
  parameters_00 = &event;
  parameters_01 = &event;
  event.field_1._4_8_ = 0;
  event._0_8_ = this;
  event.input_._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:278:26)>
                ::_M_invoke;
  event.field_1._12_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:278:26)>
       ::_M_manager;
  local_168._8_8_ = component;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)&event);
  std::_Function_base::~_Function_base((_Function_base *)&event);
  handler = extraout_RDX;
  for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 4) {
    anon_unknown_0::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)(ulong)*(uint *)((long)&DAT_00149758 + lVar9),0x1373d8,
               handler);
    handler = extraout_RDX_00;
  }
  tcgetattr(0,&local_c4);
  event._16_16_ = (undefined1  [16])0x0;
  event._0_16_ = (undefined1  [16])0x0;
  puVar6 = (undefined8 *)operator_new(0x3c);
  *(ulong *)((long)puVar6 + 0x2c) = CONCAT44(local_c4._48_4_,local_c4.c_cc._27_4_);
  *(undefined8 *)((long)puVar6 + 0x34) = local_c4._52_8_;
  puVar6[4] = local_c4.c_cc._15_8_;
  puVar6[5] = CONCAT44(local_c4.c_cc._27_4_,local_c4.c_cc._23_4_);
  puVar6[2] = CONCAT26(local_c4.c_cc._5_2_,local_c4._16_6_);
  puVar6[3] = local_c4.c_cc._7_8_;
  *puVar6 = local_c4._0_8_;
  puVar6[1] = CONCAT44(local_c4.c_lflag,local_c4.c_cflag);
  event._0_8_ = puVar6;
  event.field_1._12_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:319:26)>
       ::_M_manager;
  event.input_._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:319:26)>
                ::_M_invoke;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)&event);
  std::_Function_base::~_Function_base((_Function_base *)&event);
  local_c4.c_lflag = local_c4.c_lflag & 0xfffffff5;
  local_c4.c_cc[5] = '\0';
  local_c4.c_cc[6] = '\0';
  tcsetattr(0,0,&local_c4);
  event.field_1._12_8_ = (anonymous_namespace)::on_resize._16_8_;
  event.field_1._4_8_ = (anonymous_namespace)::on_resize._8_8_;
  event._0_8_ = (anonymous_namespace)::on_resize._0_8_;
  (anonymous_namespace)::on_resize._8_8_ = 0;
  (anonymous_namespace)::on_resize._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:332:15)>
       ::_M_manager;
  event.input_._M_dataplus._M_p = (pointer)(anonymous_namespace)::on_resize._24_8_;
  (anonymous_namespace)::on_resize._24_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:332:15)>
       ::_M_invoke;
  (anonymous_namespace)::on_resize._0_8_ = this;
  std::_Function_base::~_Function_base((_Function_base *)&event);
  paVar8 = (anon_class_1_0_00000001 *)0x1c;
  anon_unknown_0::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1c,0x13742b,handler_00);
  Loop::anon_class_1_0_00000001::operator()(paVar8);
  if (this->use_alternative_screen_ == true) {
    event.type_ = 0x419;
    __l._M_len = 1;
    __l._M_array = &event.type_;
    std::
    vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
    ::vector((vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
              *)&local_e0,__l,in_RCX);
    Loop::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&local_e0,
               (vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                *)parameters_00);
    std::
    _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
    ::~_Vector_base(&local_e0);
  }
  event.field_1._4_8_ = 0;
  event._0_8_ = this;
  event.input_._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:362:7)>
                ::_M_invoke;
  event.field_1._12_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:362:7)>
       ::_M_manager;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)&event);
  std::_Function_base::~_Function_base((_Function_base *)&event);
  local_168._0_8_ = 0x700000019;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_168;
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector((vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
            *)&local_120,__l_00,in_RCX);
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector((vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
            *)&event_listener,
           (vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
            *)&local_120);
  (anonymous_namespace)::Reset_abi_cxx11_
            ((string *)&event,(_anonymous_namespace_ *)&event_listener,parameters);
  std::operator<<((ostream *)&std::cout,(string *)&event);
  std::__cxx11::string::~string((string *)&event);
  std::
  _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::~_Vector_base((_Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                   *)&event_listener);
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector((vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
            *)&local_158,
           (vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
            *)&local_120);
  event._16_16_ = (undefined1  [16])0x0;
  event._0_16_ = (undefined1  [16])0x0;
  puVar6 = (undefined8 *)operator_new(0x18);
  __a = (__pthread_internal_list *)local_158._M_impl.super__Vector_impl_data._M_end_of_storage;
  *puVar6 = local_158._M_impl.super__Vector_impl_data._M_start;
  puVar6[1] = local_158._M_impl.super__Vector_impl_data._M_finish;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar6[2] = __a;
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  event.field_1._12_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:349:28)>
       ::_M_manager;
  event.input_._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O2/_deps/ftxui-src/src/ftxui/component/screen_interactive.cpp:349:28)>
                ::_M_invoke;
  event._0_8_ = puVar6;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
             (anonymous_namespace)::on_exit_functions,(function<void_()> *)&event);
  std::_Function_base::~_Function_base((_Function_base *)&event);
  std::
  _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::~_Vector_base(&local_158);
  std::
  _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::~_Vector_base(&local_120);
  event.field_1.mouse_.motion = 0x3ee;
  event._0_8_ = 0x3ed000003eb;
  __l_01._M_len = 3;
  __l_01._M_array = &event.type_;
  std::
  vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::vector(&local_f8,__l_01,(allocator_type *)__a);
  Loop::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_f8,
             (vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
              *)parameters_01);
  paVar8 = (anon_class_1_0_00000001 *)&local_f8;
  std::
  _Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
  ::~_Vector_base((_Vector_base<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
                   *)paVar8);
  Loop::anon_class_1_0_00000001::operator()(paVar8);
  event._0_8_ = anon_unknown_0::EventListener;
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)&this->quit_;
  ReceiverImpl<ftxui::Event>::MakeSender((ReceiverImpl<ftxui::Event> *)local_168);
  std::thread::
  thread<void(*)(std::atomic<bool>*,std::unique_ptr<ftxui::SenderImpl<ftxui::Event>,std::default_delete<ftxui::SenderImpl<ftxui::Event>>>),std::atomic<bool>*,std::unique_ptr<ftxui::SenderImpl<ftxui::Event>,std::default_delete<ftxui::SenderImpl<ftxui::Event>>>,void>
            (&event_listener,
             (_func_void_atomic<bool>_ptr_unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
              **)&event,(atomic<bool> **)&local_158,
             (unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
              *)local_168);
  std::
  unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  ::~unique_ptr((unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
                 *)local_168);
  do {
    if (((this->quit_)._M_base._M_i & 1U) != 0) {
LAB_00137262:
      signal = (int)&event_listener;
      std::thread::join();
      anon_unknown_0::OnExit(signal);
      std::thread::~thread(&event_listener);
      return;
    }
    bVar5 = ReceiverImpl<ftxui::Event>::HasPending
                      ((this->event_receiver_)._M_t.
                       super___uniq_ptr_impl<ftxui::ReceiverImpl<ftxui::Event>,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
                       .super__Head_base<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_false>.
                       _M_head_impl);
    if (!bVar5) {
      std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_108,
                 (__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
      Draw(this,(Component *)&local_108);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
      Screen::ToString_abi_cxx11_((string *)&event,&this->super_Screen);
      poVar7 = std::operator<<((ostream *)&std::cout,(string *)&event);
      std::operator<<(poVar7,(string *)&this->set_cursor_position);
      std::__cxx11::string::~string((string *)&event);
      anon_unknown_0::Flush();
      Screen::Clear(&this->super_Screen);
    }
    auVar4._12_4_ = 0;
    auVar4._0_12_ = event.field_1._0_12_;
    event._0_16_ = auVar4 << 0x20;
    event.input_._M_dataplus._M_p = (pointer)&event.input_.field_2;
    event.input_._M_string_length = 0;
    event.input_.field_2._M_local_buf[0] = '\0';
    event.screen_ = (ScreenInteractive *)0x0;
    bVar5 = ReceiverImpl<ftxui::Event>::Receive
                      ((this->event_receiver_)._M_t.
                       super___uniq_ptr_impl<ftxui::ReceiverImpl<ftxui::Event>,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_std::default_delete<ftxui::ReceiverImpl<ftxui::Event>_>_>
                       .super__Head_base<0UL,_ftxui::ReceiverImpl<ftxui::Event>_*,_false>.
                       _M_head_impl,&event);
    auVar4 = (undefined1  [16])event._0_16_;
    if (!bVar5) {
      std::__cxx11::string::~string((string *)&event.input_);
      goto LAB_00137262;
    }
    if (event.type_ == Mouse) {
      uVar1 = this->cursor_x_;
      uVar2 = this->cursor_y_;
      event.field_1._12_8_ =
           CONCAT44((int)((ulong)event.field_1._12_8_ >> 0x20) - uVar2,
                    (int)event.field_1._12_8_ - uVar1);
LAB_00137218:
      plVar3 = *(long **)local_168._8_8_;
      event.screen_ = this;
      Event::Event((Event *)local_88,&event);
      (**(code **)(*plVar3 + 0x18))(plVar3,(Event *)local_88);
      std::__cxx11::string::~string((string *)(local_88 + 0x18));
    }
    else {
      if (event.type_ != CursorReporting) goto LAB_00137218;
      this->cursor_x_ = event.field_1.cursor_.x;
      this->cursor_y_ = event.field_1._4_4_;
      event._0_16_ = auVar4;
    }
    std::__cxx11::string::~string((string *)&event.input_);
  } while( true );
}

Assistant:

void ScreenInteractive::Loop(Component component) {
  on_exit_functions.push([this] { ExitLoopClosure()(); });

  // Install signal handlers to restore the terminal state on exit. The default
  // signal handlers are restored on exit.
  for (int signal : {SIGTERM, SIGSEGV, SIGINT, SIGILL, SIGABRT, SIGFPE})
    install_signal_handler(signal, OnExit);

    // Save the old terminal configuration and restore it on exit.
#if defined(_WIN32)
  // Enable VT processing on stdout and stdin
  auto stdout_handle = GetStdHandle(STD_OUTPUT_HANDLE);
  auto stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  DWORD out_mode = 0;
  DWORD in_mode = 0;
  GetConsoleMode(stdout_handle, &out_mode);
  GetConsoleMode(stdin_handle, &in_mode);
  on_exit_functions.push([=] { SetConsoleMode(stdout_handle, out_mode); });
  on_exit_functions.push([=] { SetConsoleMode(stdin_handle, in_mode); });

  // https://docs.microsoft.com/en-us/windows/console/setconsolemode
  const int enable_virtual_terminal_processing = 0x0004;
  const int disable_newline_auto_return = 0x0008;
  out_mode |= enable_virtual_terminal_processing;
  out_mode |= disable_newline_auto_return;

  // https://docs.microsoft.com/en-us/windows/console/setconsolemode
  const int enable_line_input = 0x0002;
  const int enable_echo_input = 0x0004;
  const int enable_virtual_terminal_input = 0x0200;
  const int enable_window_input = 0x0008;
  in_mode &= ~enable_echo_input;
  in_mode &= ~enable_line_input;
  in_mode |= enable_virtual_terminal_input;
  in_mode |= enable_window_input;

  SetConsoleMode(stdin_handle, in_mode);
  SetConsoleMode(stdout_handle, out_mode);
#else
  struct termios terminal;
  tcgetattr(STDIN_FILENO, &terminal);
  on_exit_functions.push([=] { tcsetattr(STDIN_FILENO, TCSANOW, &terminal); });

  terminal.c_lflag &= ~ICANON;  // Non canonique terminal.
  terminal.c_lflag &= ~ECHO;    // Do not print after a key press.
  terminal.c_cc[VMIN] = 0;
  terminal.c_cc[VTIME] = 0;
  // auto oldf = fcntl(STDIN_FILENO, F_GETFL, 0);
  // fcntl(STDIN_FILENO, F_SETFL, oldf | O_NONBLOCK);
  // on_exit_functions.push([=] { fcntl(STDIN_FILENO, F_GETFL, oldf); });

  tcsetattr(STDIN_FILENO, TCSANOW, &terminal);

  // Handle resize.
  on_resize = [&] { event_sender_->Send(Event::Special({0})); };
  install_signal_handler(SIGWINCH, OnResize);
#endif

  // Commit state:
  auto flush = [&] {
    Flush();
    on_exit_functions.push([] { Flush(); });
  };

  auto enable = [&](std::vector<DECMode> parameters) {
    std::cout << Set(parameters);
    on_exit_functions.push([=] { std::cout << Reset(parameters); });
  };

  auto disable = [&](std::vector<DECMode> parameters) {
    std::cout << Reset(parameters);
    on_exit_functions.push([=] { std::cout << Set(parameters); });
  };

  flush();

  if (use_alternative_screen_) {
    enable({
        DECMode::kAlternateScreen,
    });
  }

  // On exit, reset cursor one line after the current drawing.
  on_exit_functions.push(
      [this] { std::cout << reset_cursor_position << std::endl; });

  disable({
      DECMode::kCursor,
      DECMode::kLineWrap,
  });

  enable({
      // DECMode::kMouseVt200,
      DECMode::kMouseAnyEvent,
      DECMode::kMouseUtf8,
      DECMode::kMouseSgrExtMode,
  });

  flush();

  auto event_listener =
      std::thread(&EventListener, &quit_, event_receiver_->MakeSender());

  // The main loop.
  while (!quit_) {
    if (!event_receiver_->HasPending()) {
      Draw(component);
      std::cout << ToString() << set_cursor_position;
      Flush();
      Clear();
    }

    Event event;
    if (!event_receiver_->Receive(&event))
      break;

    if (event.is_cursor_reporting()) {
      cursor_x_ = event.cursor_x();
      cursor_y_ = event.cursor_y();
      continue;
    }

    if (event.is_mouse()) {
      event.mouse().x -= cursor_x_;
      event.mouse().y -= cursor_y_;
    }

    event.screen_ = this;
    component->OnEvent(event);
  }

  event_listener.join();
  OnExit(0);
}